

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_pair_checker.cpp
# Opt level: O1

void __thiscall
my_algorithm::SymbolPairChecker::SymbolPairChecker
          (SymbolPairChecker *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *symbol_pairs)

{
  long *plVar1;
  ListNode<char> *pLVar2;
  long *plVar3;
  undefined8 *puVar4;
  ListNode<char> *pLVar5;
  ListNode<char> *temp_node;
  size_t sVar6;
  long *plVar7;
  long **local_98;
  undefined **local_90;
  long *plStack_88;
  long *local_80;
  long local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  string *local_60;
  string *local_58;
  undefined **local_50;
  undefined8 *local_48;
  undefined8 *puStack_40;
  undefined8 local_38;
  
  this->_vptr_SymbolPairChecker = (_func_int **)&PTR__SymbolPairChecker_0010dcf8;
  local_58 = (string *)&this->_open_symbols;
  local_68 = &(this->_open_symbols).field_2;
  (this->_open_symbols)._M_dataplus._M_p = (pointer)local_68;
  (this->_open_symbols)._M_string_length = 0;
  (this->_open_symbols).field_2._M_local_buf[0] = '\0';
  local_60 = (string *)&this->_close_symbols;
  local_70 = &(this->_close_symbols).field_2;
  (this->_close_symbols)._M_dataplus._M_p = (pointer)local_70;
  (this->_close_symbols)._M_string_length = 0;
  (this->_close_symbols).field_2._M_local_buf[0] = '\0';
  (this->_stack)._vptr_Stack = (_func_int **)&PTR__Stack_0010dd28;
  (this->_stack)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010dd58;
  pLVar2 = (ListNode<char> *)operator_new(0x18);
  pLVar2->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dd88;
  pLVar2->_next = (ListNode<char> *)0x0;
  pLVar2->element = '\0';
  (this->_stack)._list._header = pLVar2;
  (this->_stack)._list._tail = pLVar2;
  (this->_stack)._list._size = 0;
  local_98 = (long **)&PTR__LinkedList_0010dd58;
  plVar3 = (long *)operator_new(0x18);
  *plVar3 = (long)&PTR__ListNode_0010dd88;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_80 = (long *)0x0;
  local_90 = (undefined **)plVar3;
  plStack_88 = plVar3;
  pLVar2 = (ListNode<char> *)operator_new(0x18);
  pLVar2->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dd88;
  pLVar2->_next = (ListNode<char> *)0x0;
  pLVar2->element = '\0';
  (this->_stack)._list._header = pLVar2;
  (this->_stack)._list._tail = pLVar2;
  (this->_stack)._list._size = 0;
  local_98 = (long **)&PTR__LinkedList_0010dd58;
  *plVar3 = (long)&PTR__ListNode_0010dd88;
  plVar3[1] = 0;
  operator_delete(plVar3,0x18);
  local_80 = (long *)0x0;
  this->_cursor = 0;
  local_90 = (undefined **)0x0;
  plStack_88 = (long *)0x0;
  local_98 = &plStack_88;
  std::__cxx11::string::operator=(local_58,(string *)&local_98);
  if (local_98 != &plStack_88) {
    operator_delete(local_98,(long)plStack_88 + 1);
  }
  local_90 = (undefined **)0x0;
  plStack_88 = (long *)((ulong)plStack_88 & 0xffffffffffffff00);
  local_98 = &plStack_88;
  std::__cxx11::string::operator=(local_60,(string *)&local_98);
  if (local_98 != &plStack_88) {
    operator_delete(local_98,(long)plStack_88 + 1);
  }
  setSymbolPairs(this,symbol_pairs);
  local_98 = (long **)&PTR__Stack_0010dd28;
  local_90 = &PTR__LinkedList_0010dd58;
  plStack_88 = (long *)operator_new(0x18);
  *plStack_88 = (long)&PTR__ListNode_0010dd88;
  plStack_88[1] = 0;
  *(undefined1 *)(plStack_88 + 2) = 0;
  local_78 = 0;
  local_50 = &PTR__LinkedList_0010dd58;
  local_80 = plStack_88;
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = &PTR__ListNode_0010dd88;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  local_38 = 0;
  local_48 = puVar4;
  puStack_40 = puVar4;
  plStack_88 = (long *)operator_new(0x18);
  *plStack_88 = (long)&PTR__ListNode_0010dd88;
  plStack_88[1] = 0;
  *(undefined1 *)(plStack_88 + 2) = 0;
  local_78 = 0;
  local_50 = &PTR__LinkedList_0010dd58;
  *puVar4 = &PTR__ListNode_0010dd88;
  puVar4[1] = 0;
  local_80 = plStack_88;
  operator_delete(puVar4,0x18);
  local_38 = 0;
  local_48 = (undefined8 *)0x0;
  puStack_40 = (undefined8 *)0x0;
  pLVar2 = (ListNode<char> *)operator_new(0x18);
  plVar1 = local_80;
  plVar3 = plStack_88;
  pLVar2->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dd88;
  pLVar2->_next = (ListNode<char> *)0x0;
  pLVar2->element = '\0';
  (this->_stack)._list._header = pLVar2;
  (this->_stack)._list._tail = pLVar2;
  (this->_stack)._list._size = 0;
  if (local_80 == plStack_88) {
    local_98 = (long **)&PTR__Stack_0010dd28;
    local_90 = &PTR__LinkedList_0010dd58;
  }
  else {
    sVar6 = 1;
    plVar7 = plStack_88;
    do {
      plVar7 = (long *)plVar7[1];
      pLVar5 = (ListNode<char> *)operator_new(0x18);
      pLVar5->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dd88;
      pLVar5->element = (char)plVar7[2];
      pLVar5->_next = (ListNode<char> *)0x0;
      pLVar5->_next = pLVar2->_next;
      pLVar2->_next = pLVar5;
      (this->_stack)._list._size = sVar6;
      (this->_stack)._list._tail = pLVar5;
      sVar6 = sVar6 + 1;
      pLVar2 = pLVar5;
    } while (plVar1 != plVar7);
    local_98 = (long **)&PTR__Stack_0010dd28;
    local_90 = &PTR__LinkedList_0010dd58;
    do {
      plVar1 = (long *)plVar3[1];
      if (plVar1 != (long *)0x0) {
        plVar3[1] = plVar1[1];
        (**(code **)(*plVar1 + 8))(plVar1);
      }
      if (plVar1 == local_80) {
        local_80 = plVar3;
      }
      local_78 = local_78 + -1;
      plVar3 = plStack_88;
    } while (plStack_88 != local_80);
  }
  if (plStack_88 != (long *)0x0) {
    (**(code **)(*plStack_88 + 8))(plStack_88);
  }
  return;
}

Assistant:

SymbolPairChecker::SymbolPairChecker(const std::vector<std::string>& symbol_pairs) {
        _cursor = 0;
        _open_symbols = std::string();
        _close_symbols = std::string();
        setSymbolPairs(symbol_pairs);
        _stack = data_structures::Stack<char>();
    }